

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamFtp_p.cpp
# Opt level: O3

bool __thiscall BamTools::Internal::BamFtp::ConnectCommandSocket(BamFtp *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  long *plVar4;
  undefined8 *puVar5;
  size_type *psVar6;
  long *plVar7;
  string typeCommand;
  string passwordCommand;
  __string_type __str_1;
  string userCommand;
  __string_type __str_2;
  string local_d0;
  string local_b0;
  long *local_90;
  ulong local_88;
  long local_80;
  long lStack_78;
  string local_70;
  undefined1 *local_50;
  ulong local_48;
  undefined1 local_40 [16];
  
  bVar3 = TcpSocket::ConnectToHost
                    (this->m_commandSocket,&this->m_hostname,this->m_port,
                     (this->super_IBamIODevice).m_mode);
  if (bVar3) {
    bVar3 = ReceiveReply(this);
    if (bVar3) {
      paVar1 = &local_d0.field_2;
      local_d0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,USER_CMD_abi_cxx11_,DAT_001f5578 + USER_CMD_abi_cxx11_);
      std::__cxx11::string::_M_replace_aux((ulong)&local_d0,local_d0._M_string_length,0,'\x01');
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_d0,(ulong)(this->m_username)._M_dataplus._M_p);
      paVar2 = &local_b0.field_2;
      psVar6 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_b0.field_2._M_allocated_capacity = *psVar6;
        local_b0.field_2._8_8_ = plVar4[3];
        local_b0._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar6;
        local_b0._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_b0._M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_b0,FTP_NEWLINE_abi_cxx11_);
      psVar6 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_70.field_2._M_allocated_capacity = *psVar6;
        local_70.field_2._8_8_ = plVar4[3];
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar6;
        local_70._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_70._M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      bVar3 = SendCommand(this,&local_70,true);
      if (bVar3) {
        local_90 = &local_80;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,PASS_CMD_abi_cxx11_,DAT_001f5598 + PASS_CMD_abi_cxx11_);
        std::__cxx11::string::_M_replace_aux((ulong)&local_90,local_88,0,'\x01');
        plVar4 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_90,(ulong)(this->m_password)._M_dataplus._M_p);
        psVar6 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_d0.field_2._M_allocated_capacity = *psVar6;
          local_d0.field_2._8_8_ = plVar4[3];
          local_d0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar6;
          local_d0._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_d0._M_string_length = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_d0,FTP_NEWLINE_abi_cxx11_);
        psVar6 = puVar5 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_b0.field_2._M_allocated_capacity = *psVar6;
          local_b0.field_2._8_8_ = puVar5[3];
          local_b0._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_b0.field_2._M_allocated_capacity = *psVar6;
          local_b0._M_dataplus._M_p = (pointer)*puVar5;
        }
        local_b0._M_string_length = puVar5[1];
        *puVar5 = psVar6;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != paVar1) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        if (local_90 != &local_80) {
          operator_delete(local_90);
        }
        bVar3 = SendCommand(this,&local_b0,true);
        if (bVar3) {
          local_50 = local_40;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,TYPE_CMD_abi_cxx11_,DAT_001f5638 + TYPE_CMD_abi_cxx11_);
          std::__cxx11::string::_M_replace_aux((ulong)&local_50,local_48,0,'\x01');
          plVar4 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_50,local_48,0,'\x01');
          plVar7 = plVar4 + 2;
          if ((long *)*plVar4 == plVar7) {
            local_80 = *plVar7;
            lStack_78 = plVar4[3];
            local_90 = &local_80;
          }
          else {
            local_80 = *plVar7;
            local_90 = (long *)*plVar4;
          }
          local_88 = plVar4[1];
          *plVar4 = (long)plVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_90,FTP_NEWLINE_abi_cxx11_);
          psVar6 = puVar5 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar6) {
            local_d0.field_2._M_allocated_capacity = *psVar6;
            local_d0.field_2._8_8_ = puVar5[3];
            local_d0._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_d0.field_2._M_allocated_capacity = *psVar6;
            local_d0._M_dataplus._M_p = (pointer)*puVar5;
          }
          local_d0._M_string_length = puVar5[1];
          *puVar5 = psVar6;
          puVar5[1] = 0;
          *(undefined1 *)(puVar5 + 2) = 0;
          if (local_90 != &local_80) {
            operator_delete(local_90);
          }
          if (local_50 != local_40) {
            operator_delete(local_50);
          }
          bVar3 = SendCommand(this,&local_d0,true);
          if (!bVar3) {
            (*(this->super_IBamIODevice)._vptr_IBamIODevice[2])(this);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != paVar1) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
        }
        else {
          (*(this->super_IBamIODevice)._vptr_IBamIODevice[2])(this);
          bVar3 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != paVar2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
      }
      else {
        (*(this->super_IBamIODevice)._vptr_IBamIODevice[2])(this);
        bVar3 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == &local_70.field_2) {
        return bVar3;
      }
      operator_delete(local_70._M_dataplus._M_p);
      return bVar3;
    }
    (*(this->super_IBamIODevice)._vptr_IBamIODevice[2])(this);
  }
  else {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"BamFtp::ConnectCommandSocket","");
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"could not connect to host - ","");
    IBamIODevice::SetErrorString(&this->super_IBamIODevice,&local_70,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  return false;
}

Assistant:

bool BamFtp::ConnectCommandSocket()
{

    BT_ASSERT_X(m_commandSocket, "null command socket?");

    // connect to FTP server
    if (!m_commandSocket->ConnectToHost(m_hostname, m_port, m_mode)) {
        SetErrorString("BamFtp::ConnectCommandSocket", "could not connect to host - ");
        return false;
    }

    // receive initial reply from host
    if (!ReceiveReply()) {
        Close();
        return false;
    }

    // send USER command
    std::string userCommand = USER_CMD + CMD_SEPARATOR + m_username + FTP_NEWLINE;
    if (!SendCommand(userCommand, true)) {
        Close();
        return false;
    }

    // send PASS command
    std::string passwordCommand = PASS_CMD + CMD_SEPARATOR + m_password + FTP_NEWLINE;
    if (!SendCommand(passwordCommand, true)) {
        Close();
        return false;
    }

    // send TYPE command
    std::string typeCommand = TYPE_CMD + CMD_SEPARATOR + 'I' + FTP_NEWLINE;
    if (!SendCommand(typeCommand, true)) {
        Close();
        return false;
    }

    // return success
    return true;
}